

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O2

bool __thiscall
glcts::ProgramUniformCase::setAndCompareUniforms
          (ProgramUniformCase *this,GLuint pipeline,GLuint programA,GLuint programB,DataType dType,
          int seed)

{
  int *piVar1;
  size_type *this_00;
  int *piVar2;
  TestLog *pTVar3;
  DataType DVar4;
  Functions *pFVar5;
  glGetUniformfvFunc *pp_Var6;
  int iVar7;
  GLint GVar8;
  undefined4 extraout_var;
  Functions *pFVar9;
  TestError *pTVar10;
  long lVar11;
  ulong uVar12;
  Functions *pFVar13;
  uint *puVar14;
  GLint *location;
  int local_3a0;
  GLuint local_39c;
  GLuint local_398;
  DataType local_394;
  ProgramUniformCase *local_390;
  Functions *local_388;
  glGetUniformfvFunc *local_380;
  undefined8 local_378;
  Functions *local_370;
  int local_368;
  GLuint local_364;
  int local_360;
  int local_35c;
  GLuint activeProgram;
  uint udata [30];
  GLint locationA [12];
  GLint locationB [12];
  string uniformBaseName;
  string local_238;
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string name;
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_39c = programA;
  local_398 = programB;
  local_390 = this;
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_388 = (Functions *)CONCAT44(extraout_var,iVar7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&uniformBaseName,"uVal",(allocator<char> *)&name);
  this_00 = &name._M_string_length;
  name._M_dataplus._M_p = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  local_394 = dType;
  local_364 = pipeline;
  local_360 = seed;
  std::operator<<((ostream *)this_00,"Begin:ProgramUniformCase iterate");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&name,(EndMessageToken *)&tcu::TestLog::EndMessage);
  pFVar13 = local_388;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  for (local_3a0 = 0; local_3a0 < 4; local_3a0 = local_3a0 + 1) {
    de::toString<int>((string *)&activeProgram,&local_3a0);
    std::operator+(&name,&uniformBaseName,(string *)&activeProgram);
    std::__cxx11::string::~string((string *)&activeProgram);
    GVar8 = (*pFVar13->getUniformLocation)(local_39c,name._M_dataplus._M_p);
    locationA[local_3a0] = GVar8;
    GVar8 = (*pFVar13->getUniformLocation)(local_398,name._M_dataplus._M_p);
    locationB[local_3a0] = GVar8;
    std::__cxx11::string::~string((string *)&name);
  }
  local_370 = pFVar13;
  iVar7 = 0;
  while (pFVar13 = local_370, iVar7 != 4) {
    local_380 = (glGetUniformfvFunc *)CONCAT44(local_380._4_4_,iVar7);
    local_378 = (glGetUniformfvFunc *)(CONCAT44(local_378._4_4_,iVar7) | 4);
    local_368 = 0;
    while( true ) {
      if (1 < local_368) break;
      local_35c = (int)local_378;
      de::toString<int>(&local_218,&local_35c);
      std::operator+(&local_1f8,&uniformBaseName,&local_218);
      std::operator+(&local_1d8,&local_1f8,"[");
      de::toString<int>(&local_238,&local_368);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &activeProgram,&local_1d8,&local_238);
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &activeProgram,"]");
      std::__cxx11::string::~string((string *)&activeProgram);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      pFVar13 = local_370;
      GVar8 = (*local_370->getUniformLocation)(local_39c,name._M_dataplus._M_p);
      locationA[local_3a0] = GVar8;
      GVar8 = (*pFVar13->getUniformLocation)(local_398,name._M_dataplus._M_p);
      locationB[local_3a0] = GVar8;
      local_3a0 = local_3a0 + 1;
      std::__cxx11::string::~string((string *)&name);
      local_368 = local_368 + 1;
    }
    iVar7 = (int)local_380 + 1;
  }
  lVar11 = 0;
  if (local_394 == TYPE_FLOAT) {
    for (; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
      udata[lVar11] = (uint)(float)(local_360 + (int)lVar11);
    }
  }
  else {
    for (; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
      udata[lVar11] = local_360 + (int)lVar11;
    }
  }
  local_3a0 = 0x1e;
  if (local_394 == TYPE_INT) {
    progUniformi(local_390,local_370,local_39c,2,locationA,(int *)udata);
  }
  else if (local_394 == TYPE_UINT) {
    progUniformui(local_390,local_370,local_39c,2,locationA,udata);
  }
  else if (local_394 == TYPE_FLOAT) {
    progUniformf(local_390,local_370,local_39c,2,locationA,(float *)udata);
  }
  local_380 = &local_388->getUniformfv;
  local_378 = (glGetUniformfvFunc *)&local_388->getUniformuiv;
  local_388 = (Functions *)&local_388->getUniformiv;
  puVar14 = udata;
  for (local_3a0 = 0; pp_Var6 = local_378, pFVar9 = (Functions *)local_380, pFVar5 = local_388,
      local_3a0 < 0xc; local_3a0 = local_3a0 + 1) {
    if (local_394 == TYPE_INT) {
      (**(glGetUniformfvFunc *)local_388)(local_39c,locationA[local_3a0],(GLfloat *)&name);
      pFVar9 = pFVar5;
      pFVar13 = local_370;
LAB_00c00096:
      (**(glGetUniformfvFunc *)pFVar9)(local_398,locationB[local_3a0],(GLfloat *)&activeProgram);
    }
    else {
      if (local_394 == TYPE_UINT) {
        (**local_378)(local_39c,locationA[local_3a0],(GLfloat *)&name);
        pFVar9 = (Functions *)pp_Var6;
        goto LAB_00c00096;
      }
      if (local_394 == TYPE_FLOAT) {
        (**local_380)(local_39c,locationA[local_3a0],(GLfloat *)&name);
        goto LAB_00c00096;
      }
    }
    uVar12 = (ulong)*(uint *)(&DAT_017411f0 + (long)local_3a0 * 4);
    if ((int)*(uint *)(&DAT_017411f0 + (long)local_3a0 * 4) < 1) {
      uVar12 = 0;
    }
    lVar11 = 0;
    while (uVar12 * 4 != lVar11) {
      iVar7 = *(int *)((long)&name._M_dataplus._M_p + lVar11);
      if ((iVar7 != *(int *)((long)puVar14 + lVar11)) ||
         (piVar1 = (int *)((long)&activeProgram + lVar11), lVar11 = lVar11 + 4, iVar7 == *piVar1)) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"ProgramUniformi failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x5d7);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    puVar14 = (uint *)((long)puVar14 + lVar11);
  }
  if (local_394 == TYPE_FLOAT) {
    udata[0] = (uint)((float)udata[0x1d] + 1.0);
    for (lVar11 = 1; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
      udata[lVar11] = (uint)((float)udata[lVar11 + -1] + 1.0);
    }
  }
  else {
    udata[0] = udata[0x1d] + 1;
    for (lVar11 = 1; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
      udata[lVar11] = udata[lVar11 + -1] + 1;
    }
  }
  local_3a0 = 0x1e;
  if (local_394 == TYPE_INT) {
    progUniformi(local_390,pFVar13,local_398,2,locationB,(int *)udata);
  }
  else if (local_394 == TYPE_UINT) {
    progUniformui(local_390,pFVar13,local_398,2,locationB,udata);
  }
  else if (local_394 == TYPE_FLOAT) {
    progUniformf(local_390,pFVar13,local_398,2,locationB,(float *)udata);
  }
  puVar14 = udata;
  local_3a0 = 0;
  do {
    pp_Var6 = local_378;
    pFVar9 = (Functions *)local_380;
    pFVar5 = local_388;
    if (0xb < local_3a0) {
      activeProgram = 0;
      if (((local_364 != 0) &&
          ((*pFVar13->getProgramPipelineiv)(local_364,0x8259,(GLint *)&activeProgram),
          DVar4 = local_394, activeProgram != 0)) &&
         (activeProgram == local_39c || activeProgram == local_398)) {
        location = locationB;
        if (activeProgram == local_39c) {
          location = locationA;
        }
        if (local_394 == TYPE_FLOAT) {
          udata[0] = (uint)((float)udata[0x1d] + 1.0);
          for (lVar11 = 1; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
            udata[lVar11] = (uint)((float)udata[lVar11 + -1] + 1.0);
          }
        }
        else {
          udata[0] = udata[0x1d] + 1;
          for (lVar11 = 1; lVar11 != 0x1e; lVar11 = lVar11 + 1) {
            udata[lVar11] = udata[lVar11 + -1] + 1;
          }
        }
        local_3a0 = 0x1e;
        if (local_394 == TYPE_INT) {
          activeUniformi(local_390,pFVar13,2,location,(int *)udata);
        }
        else if (local_394 == TYPE_UINT) {
          activeUniformui(local_390,pFVar13,2,location,udata);
        }
        else if (local_394 == TYPE_FLOAT) {
          activeUniformf(local_390,pFVar13,2,location,(float *)udata);
        }
        pFVar13 = (Functions *)local_380;
        if (DVar4 == TYPE_UINT) {
          pFVar13 = (Functions *)local_378;
        }
        if (DVar4 == TYPE_INT) {
          pFVar13 = local_388;
        }
        puVar14 = udata;
        for (local_3a0 = 0; local_3a0 < 0xc; local_3a0 = local_3a0 + 1) {
          if ((local_394 < TYPE_UINT_VEC2) && ((0x88000002U >> (local_394 & TYPE_UINT) & 1) != 0)) {
            (**(glGetUniformfvFunc *)pFVar13)(activeProgram,location[local_3a0],(GLfloat *)&name);
          }
          uVar12 = (ulong)*(uint *)(&DAT_017411f0 + (long)local_3a0 * 4);
          if ((int)*(uint *)(&DAT_017411f0 + (long)local_3a0 * 4) < 1) {
            uVar12 = 0;
          }
          for (lVar11 = 0; uVar12 * 4 != lVar11; lVar11 = lVar11 + 4) {
            if (*(int *)((long)&name._M_dataplus._M_p + lVar11) != *(int *)((long)puVar14 + lVar11))
            {
              pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar10,"ActiveShaderProgram failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                         ,0x663);
              __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
          }
          puVar14 = (uint *)((long)puVar14 + lVar11);
        }
      }
      std::__cxx11::string::~string((string *)&uniformBaseName);
      return true;
    }
    if (local_394 == TYPE_INT) {
      (**(glGetUniformfvFunc *)local_388)(local_39c,locationA[local_3a0],(GLfloat *)&name);
      pFVar9 = pFVar5;
      pFVar13 = local_370;
LAB_00c0027e:
      (**(glGetUniformfvFunc *)pFVar9)(local_398,locationB[local_3a0],(GLfloat *)&activeProgram);
    }
    else {
      if (local_394 == TYPE_UINT) {
        (**local_378)(local_39c,locationA[local_3a0],(GLfloat *)&name);
        pFVar9 = (Functions *)pp_Var6;
        goto LAB_00c0027e;
      }
      if (local_394 == TYPE_FLOAT) {
        (**local_380)(local_39c,locationA[local_3a0],(GLfloat *)&name);
        goto LAB_00c0027e;
      }
    }
    uVar12 = (ulong)*(uint *)(&DAT_017411f0 + (long)local_3a0 * 4);
    if ((int)*(uint *)(&DAT_017411f0 + (long)local_3a0 * 4) < 1) {
      uVar12 = 0;
    }
    lVar11 = 0;
    while (uVar12 * 4 != lVar11) {
      piVar1 = (int *)((long)&activeProgram + lVar11);
      if ((*piVar1 != *(int *)((long)puVar14 + lVar11)) ||
         (piVar2 = (int *)((long)&name._M_dataplus._M_p + lVar11), lVar11 = lVar11 + 4,
         *piVar2 == *piVar1)) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"ProgramUniformi failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                   ,0x619);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    local_3a0 = local_3a0 + 1;
    puVar14 = (uint *)((long)puVar14 + lVar11);
  } while( true );
}

Assistant:

bool setAndCompareUniforms(glw::GLuint pipeline, glw::GLuint programA, glw::GLuint programB, glu::DataType dType,
							   int seed)
	{
		TestLog&			  log = m_testCtx.getLog();
		const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
		// The fragment shader has defined uniforms of type:
		// scalar, vec2, vec3, vec4, and then length 2 arrays of
		// scalar, vec2, vec3, and vec4.
		// 4 uniforms in array form and 4 not in arrays.
		// We query a total of 12 uniform locations
		const int nonarrayUnifCount = 4;
		const int arrayUnifCount	= 4;
		const int arraySize			= 2;
		const int locationCount		= nonarrayUnifCount + arraySize * arrayUnifCount;
		// dwordCount represents the number of dwords to compare for each uniform location
		// scalar, vec2, vec3, vec4, scalar[0], scalar[1], vec2[0], vec2[1], etc.
		const int  dwordCount[locationCount] = { 1, 2, 3, 4, 1, 1, 2, 2, 3, 3, 4, 4 };
		glw::GLint locationA[locationCount];
		glw::GLint locationB[locationCount];
		// The total amount of data the uniforms take up: 1+2+3+4 + 2*(1+2+3+4)
		const int	udataCount = 30;
		unsigned int udata[udataCount]; //
		int*		 data  = (int*)&udata[0];
		float*		 fdata = (float*)&udata[0];
		int			 i, j, k;
		std::string  uniformBaseName("uVal");

		// ProgramUniform API verification
		log << TestLog::Message << "Begin:ProgramUniformCase iterate" << TestLog::EndMessage;

		// get uniform locations
		// scalar and vec uniforms
		for (i = 0; i < nonarrayUnifCount; i++)
		{
			string name  = uniformBaseName + de::toString(i);
			locationA[i] = gl.getUniformLocation(programA, name.c_str());
			locationB[i] = gl.getUniformLocation(programB, name.c_str());
		}
		// uniform arrays
		for (j = 0; j < arrayUnifCount; j++)
		{
			for (k = 0; k < arraySize; k++)
			{
				string name  = uniformBaseName + de::toString(nonarrayUnifCount + j) + "[" + de::toString(k) + "]";
				locationA[i] = gl.getUniformLocation(programA, name.c_str());
				locationB[i] = gl.getUniformLocation(programB, name.c_str());
				i++;
			}
		}

		// seed data buffer with unique values
		if (dType == glu::TYPE_FLOAT)
		{
			for (i = 0; i < udataCount; i++)
			{
				fdata[i] = (float)(seed + i);
			}
		}
		else
		{
			for (i = 0; i < udataCount; i++)
			{
				data[i] = seed + i;
			}
		}

		// set uniforms in program A
		if (dType == glu::TYPE_INT)
		{
			progUniformi(gl, programA, arraySize, locationA, data);
		}
		else if (dType == glu::TYPE_UINT)
		{
			progUniformui(gl, programA, arraySize, locationA, udata);
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			progUniformf(gl, programA, arraySize, locationA, fdata);
		}

		// get and compare uniforms
		unsigned int* uValue = &udata[0];
		for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
		{
			unsigned int retValA[4], retValB[4];

			if (dType == glu::TYPE_INT)
			{
				gl.getUniformiv(programA, locationA[i], (int*)&retValA[0]);
				gl.getUniformiv(programB, locationB[i], (int*)&retValB[0]);
			}
			else if (dType == glu::TYPE_UINT)
			{
				gl.getUniformuiv(programA, locationA[i], &retValA[0]);
				gl.getUniformuiv(programB, locationB[i], &retValB[0]);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				gl.getUniformfv(programA, locationA[i], (float*)&retValA[0]);
				gl.getUniformfv(programB, locationB[i], (float*)&retValB[0]);
			}

			for (j = 0; j < dwordCount[i]; j++)
			{
				// Compare programA uniform to expected value and
				// test to see if programB picked up the value.
				if ((retValA[j] != *uValue++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// reseed data buffer, continuing to increment
		if (dType == glu::TYPE_FLOAT)
		{
			fdata[0] = fdata[udataCount - 1] + 1.0f;
			for (i = 1; i < udataCount; i++)
			{
				fdata[i] = fdata[i - 1] + 1.0f;
			}
		}
		else
		{
			data[0] = data[udataCount - 1] + 1;
			for (i = 1; i < udataCount; i++)
			{
				data[i] = data[i - 1] + 1;
			}
		}

		// set uniforms in program B

		if (dType == glu::TYPE_INT)
		{
			progUniformi(gl, programB, arraySize, locationB, data);
		}
		else if (dType == glu::TYPE_UINT)
		{
			progUniformui(gl, programB, arraySize, locationB, udata);
		}
		else if (dType == glu::TYPE_FLOAT)
		{
			progUniformf(gl, programB, arraySize, locationB, fdata);
		}

		// get and compare uniforms
		uValue = &udata[0];
		for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
		{
			unsigned int retValA[4], retValB[4];

			if (dType == glu::TYPE_INT)
			{
				gl.getUniformiv(programA, locationA[i], (int*)&retValA[0]);
				gl.getUniformiv(programB, locationB[i], (int*)&retValB[0]);
			}
			else if (dType == glu::TYPE_UINT)
			{
				gl.getUniformuiv(programA, locationA[i], &retValA[0]);
				gl.getUniformuiv(programB, locationB[i], &retValB[0]);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				gl.getUniformfv(programA, locationA[i], (float*)&retValA[0]);
				gl.getUniformfv(programB, locationB[i], (float*)&retValB[0]);
			}

			for (j = 0; j < dwordCount[i]; j++)
			{
				// Compare programB uniform to expected value and
				// test to see if programA picked up the value.
				if ((retValB[j] != *uValue++) || (retValA[j] == retValB[j]))
				{
					TCU_FAIL("ProgramUniformi failed");
				}
			}
		}

		// Test the conventional uniform interfaces on an ACTIVE_PROGRAM
		glw::GLuint activeProgram = 0;
		if (pipeline != 0)
		{
			gl.getProgramPipelineiv(pipeline, GL_ACTIVE_PROGRAM, (int*)&activeProgram);
		}
		if ((activeProgram != 0) && ((activeProgram == programA) || (activeProgram == programB)))
		{
			glw::GLint* location;

			location = (activeProgram == programA) ? locationA : locationB;

			// reseed data buffer, continuing to increment
			if (dType == glu::TYPE_FLOAT)
			{
				fdata[0] = fdata[udataCount - 1] + 1.0f;
				for (i = 1; i < udataCount; i++)
				{
					fdata[i] = fdata[i - 1] + 1.0f;
				}
			}
			else
			{
				data[0] = data[udataCount - 1] + 1;
				for (i = 1; i < udataCount; i++)
				{
					data[i] = data[i - 1] + 1;
				}
			}

			// set uniforms using original glUniform*

			if (dType == glu::TYPE_INT)
			{
				activeUniformi(gl, arraySize, location, data);
			}
			else if (dType == glu::TYPE_UINT)
			{
				activeUniformui(gl, arraySize, location, udata);
			}
			else if (dType == glu::TYPE_FLOAT)
			{
				activeUniformf(gl, arraySize, location, fdata);
			}

			// get and compare uniforms
			uValue = &udata[0];
			for (i = 0; i < nonarrayUnifCount + arraySize * arrayUnifCount; i++)
			{
				unsigned int retVal[4];

				if (dType == glu::TYPE_INT)
				{
					gl.getUniformiv(activeProgram, location[i], (int*)&retVal[0]);
				}
				else if (dType == glu::TYPE_UINT)
				{
					gl.getUniformuiv(activeProgram, location[i], &retVal[0]);
				}
				else if (dType == glu::TYPE_FLOAT)
				{
					gl.getUniformfv(activeProgram, location[i], (float*)&retVal[0]);
				}

				for (j = 0; j < dwordCount[i]; j++)
				{
					// Compare activeProgram uniform to expected value
					if ((retVal[j] != *uValue++))
					{
						TCU_FAIL("ActiveShaderProgram failed");
					}
				}
			}
		}

		return true;
	}